

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

size_t defaultPrevCharLen(char *buf,size_t param_2,size_t pos,size_t *col_len)

{
  ulong uVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long lVar4;
  unsigned_long *puVar5;
  int end;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int cp;
  undefined8 uStack_38;
  
  sVar7 = pos;
  uStack_38 = in_RAX;
  if (pos == 0) {
    return 0;
  }
  do {
    uVar6 = (uint)sVar7;
    uVar2 = (int)uVar6 >> 0x1f & uVar6;
    if (0 < (int)uVar6) {
      uVar2 = uVar6;
    }
    sVar8 = (size_t)(int)(uVar6 - (uVar2 - 1));
    sVar7 = sVar7 - sVar8;
    utf8BytesToCodePoint(buf + sVar7,sVar8,(int *)((long)&uStack_38 + 4));
    uVar3 = (ulong)(int)uStack_38._4_4_;
    lVar4 = 0;
LAB_0013361e:
    if (uVar3 < *(ulong *)((long)combiningCharTable + lVar4)) goto LAB_0013363c;
    if (*(ulong *)((long)combiningCharTable + lVar4) != uVar3) break;
    if (sVar7 == 0) {
      return 0;
    }
  } while( true );
  lVar4 = lVar4 + 8;
  if (lVar4 == 0x3f20) {
LAB_0013363c:
    if (col_len == (size_t *)0x0) goto LAB_001336a0;
    sVar8 = 1;
    if ((uStack_38._4_4_ < 0x1100) || (sVar8 = 2, uStack_38._4_4_ < 0x1160)) goto LAB_0013369d;
    puVar5 = wideCharTable[1] + 1;
    uVar10 = 0;
    goto LAB_00133662;
  }
  goto LAB_0013361e;
  while( true ) {
    if (uVar3 < (*(unsigned_long (*) [2])(puVar5 + -1))[0]) {
      uVar10 = 0;
      goto LAB_0013368d;
    }
    uVar1 = *puVar5;
    puVar5 = puVar5 + 2;
    uVar10 = uVar9 + 1;
    if (uVar3 <= uVar1) break;
LAB_00133662:
    uVar9 = uVar10;
    uVar10 = uVar9;
    if (uVar9 == 0x79) goto LAB_0013368d;
  }
  uVar10 = 1;
LAB_0013368d:
  sVar8 = (ulong)(uVar9 < 0x79 & (byte)uVar10) + 1;
LAB_0013369d:
  *col_len = sVar8;
LAB_001336a0:
  return pos - sVar7;
}

Assistant:

static size_t defaultPrevCharLen(const char * buf, size_t /*buf_len*/, size_t pos, size_t * col_len) {
    size_t end = pos;
    while (pos > 0) {
        size_t len = prevUtf8CodePointLen(buf, pos);
        pos -= len;
        int cp;
        utf8BytesToCodePoint(buf + pos, len, &cp);
        if (!isCombiningChar(cp)) {
            if (col_len != NULL) {
                *col_len = isWideChar(cp) ? 2 : 1;
            }
            return end - pos;
        }
    }
    /* NOTREACHED */
    return 0;
}